

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O1

int __thiscall
ws::Crypto::verify_sign
          (Crypto *this,string *msg_sign,string *time_stamp,string *nonce,string *msg_encrypt)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  long *plVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args;
  string dev_msg_sign;
  string local_f0;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_b0[0] = local_a0;
  pcVar1 = (this->token)._M_dataplus._M_p;
  psVar3 = nonce;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar1,pcVar1 + (this->token)._M_string_length);
  local_90[0] = local_80;
  pcVar1 = (time_stamp->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + time_stamp->_M_string_length);
  local_70[0] = local_60;
  pcVar1 = (nonce->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + nonce->_M_string_length);
  plVar4 = local_40;
  pcVar1 = (msg_encrypt->_M_dataplus)._M_p;
  local_50[0] = plVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + msg_encrypt->_M_string_length);
  args._M_len = (size_type)psVar3;
  args._M_array = (iterator)0x4;
  wx_sort(&local_f0,(ws *)local_b0,args);
  wx_sha1(&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  lVar5 = -0x80;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  iVar2 = -1;
  if (local_d0._M_string_length == msg_sign->_M_string_length) {
    if (local_d0._M_string_length == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = bcmp(local_d0._M_dataplus._M_p,(msg_sign->_M_dataplus)._M_p,local_d0._M_string_length)
      ;
      iVar2 = -(uint)(iVar2 != 0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int verify_sign(const std::string &msg_sign, const std::string &time_stamp,
                    const std::string &nonce, const std::string &msg_encrypt)
    {
      std::string dev_msg_sign = wx_sha1(wx_sort({token, time_stamp, nonce, msg_encrypt}));
      if (dev_msg_sign == msg_sign)
      {
        return 0;
      }
      else
        return -1;
    }